

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pFVar3;
  string *psVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  pointer pZVar6;
  size_type sVar7;
  reference pvVar8;
  undefined4 extraout_var_02;
  AlphaNum *pAVar9;
  string_view text;
  undefined1 auVar10 [16];
  AnnotationCollector *local_7e8;
  string_view local_7a0;
  int local_78c;
  undefined1 local_788 [4];
  int i_1;
  Printer annotation_list_printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  annotation_list_raw_output;
  int local_63c;
  undefined1 local_638 [4];
  int i;
  Printer srclist_printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  srclist_raw_output;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  Printer printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  AlphaNum local_350;
  undefined1 local_320 [8];
  string info_full_path;
  AlphaNum local_2d0;
  AlphaNum local_2a0;
  undefined1 local_270 [8];
  string java_filename;
  undefined1 local_230 [8];
  string package_dir;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *file_generator_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  *__range3_2;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *file_generator;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  *__range3_1;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  local_1c8;
  undefined1 local_1b9;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  local_1b8;
  undefined1 local_1b0 [8];
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  file_generators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  AlphaNum local_160;
  AlphaNum local_130;
  string local_100;
  reference local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *option;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  Options file_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  JavaGenerator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  parameter_local = (string *)file;
  file_local = (FileDescriptor *)this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter);
  pAVar9 = auVar10._0_8_;
  text._M_str = (char *)local_50;
  text._M_len = auVar10._8_8_;
  ParseGeneratorParameter
            ((compiler *)pAVar9,text,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pAVar9);
  java::Options::Options((Options *)&__range3);
  __range3._4_1_ = this->opensource_runtime_ & 1;
  __end3 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
  option = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_50);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&option), bVar1) {
    local_e0 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end3);
    bVar1 = std::operator==(&local_e0->first,"output_list_file");
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(file_options.annotation_list_file.field_2._M_local_buf + 8),
                 (string *)&local_e0->second);
    }
    else {
      bVar1 = std::operator==(&local_e0->first,"immutable");
      if (bVar1) {
        __range3._0_1_ = 1;
      }
      else {
        bVar1 = std::operator==(&local_e0->first,"mutable");
        if (bVar1) {
          __range3._1_1_ = 1;
        }
        else {
          bVar1 = std::operator==(&local_e0->first,"shared");
          if (bVar1) {
            __range3._2_1_ = 1;
          }
          else {
            bVar1 = std::operator==(&local_e0->first,"lite");
            if (bVar1) {
              __range3._3_1_ = 1;
            }
            else {
              bVar1 = std::operator==(&local_e0->first,"annotate_code");
              if (bVar1) {
                __range3._5_1_ = 1;
              }
              else {
                bVar1 = std::operator==(&local_e0->first,"annotation_list_file");
                if (bVar1) {
                  std::__cxx11::string::operator=
                            ((string *)&file_options,(string *)&local_e0->second);
                }
                else {
                  bVar1 = std::operator==(&local_e0->first,
                                          "experimental_strip_nonfunctional_codegen");
                  if (!bVar1) {
                    absl::lts_20250127::AlphaNum::AlphaNum(&local_130,"Unknown generator option: ");
                    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                              (&local_160,&local_e0->first);
                    absl::lts_20250127::StrCat_abi_cxx11_
                              (&local_100,(lts_20250127 *)&local_130,&local_160,pAVar9);
                    std::__cxx11::string::operator=
                              ((string *)
                               options.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)&local_100);
                    std::__cxx11::string::~string((string *)&local_100);
                    this_local._7_1_ = 0;
                    goto LAB_001f690d;
                  }
                  file_options.output_list_file.field_2._M_local_buf[8] = '\x01';
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end3);
  }
  if (((__range3._3_1_ & 1) == 0) || ((__range3._1_1_ & 1) == 0)) {
    if ((((byte)__range3 & 1) == 0) && (((__range3._1_1_ & 1) == 0 && ((__range3._2_1_ & 1) == 0))))
    {
      __range3._0_1_ = 1;
      __range3._2_1_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&all_annotations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&file_generators.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ::vector((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              *)local_1b0);
    if (((byte)__range3 & 1) != 0) {
      local_1b9 = 1;
      std::
      make_unique<google::protobuf::compiler::java::FileGenerator,google::protobuf::FileDescriptor_const*&,google::protobuf::compiler::java::Options&,bool>
                ((FileDescriptor **)&local_1b8,(Options *)&parameter_local,(bool *)&__range3);
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                  *)local_1b0,&local_1b8);
      std::
      unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::~unique_ptr(&local_1b8);
    }
    if ((__range3._1_1_ & 1) != 0) {
      std::
      make_unique<google::protobuf::compiler::java::FileGenerator,google::protobuf::FileDescriptor_const*&,google::protobuf::compiler::java::Options&,bool>
                ((FileDescriptor **)&local_1c8,(Options *)&parameter_local,(bool *)&__range3);
      std::
      vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                  *)local_1b0,&local_1c8);
      std::
      unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
      ::~unique_ptr(&local_1c8);
    }
    __end3_1 = std::
               vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               ::begin((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                        *)local_1b0);
    file_generator =
         (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
          *)std::
            vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
            ::end((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                   *)local_1b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
                               *)&file_generator), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
                ::operator*(&__end3_1);
      pFVar3 = std::
               unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ::operator->(this_00);
      bVar1 = FileGenerator::Validate
                        (pFVar3,&(options.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_001f68c1;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
      ::operator++(&__end3_1);
    }
    __end3_2 = std::
               vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               ::begin((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                        *)local_1b0);
    file_generator_1 =
         (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
          *)std::
            vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
            ::end((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                   *)local_1b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
                               *)&file_generator_1), bVar1) {
      package_dir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
           ::operator*(&__end3_2);
      pFVar3 = std::
               unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                             *)package_dir.field_2._8_8_);
      psVar4 = FileGenerator::java_package_abi_cxx11_(pFVar3);
      std::__cxx11::string::string
                ((string *)(java_filename.field_2._M_local_buf + 8),(string *)psVar4);
      JavaPackageToDir((string *)local_230,(string *)((long)&java_filename.field_2 + 8));
      std::__cxx11::string::~string((string *)(java_filename.field_2._M_local_buf + 8));
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
      pFVar3 = std::
               unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                             *)package_dir.field_2._8_8_);
      psVar4 = FileGenerator::classname_abi_cxx11_(pFVar3);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_2d0,psVar4);
      absl::lts_20250127::AlphaNum::AlphaNum
                ((AlphaNum *)((long)&info_full_path.field_2 + 8),".java");
      pAVar9 = (AlphaNum *)((long)&info_full_path.field_2 + 8);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_270,(lts_20250127 *)&local_2a0,&local_2d0,pAVar9,(AlphaNum *)error)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&all_annotations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_270);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_350,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&output,".pb.meta");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_320,(lts_20250127 *)&local_350,(AlphaNum *)&output,pAVar9);
      if ((__range3._5_1_ & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&file_generators.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_320);
      }
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_270);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&annotations.field_0._impl_._cached_size_,(pointer)CONCAT44(extraout_var,iVar2))
      ;
      GeneratedCodeInfo::GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 &printer.field_0x128,(GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      pZVar6 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                      *)&annotations.field_0._impl_._cached_size_);
      if ((__range3._5_1_ & 1) == 0) {
        local_7e8 = (AnnotationCollector *)0x0;
      }
      else {
        local_7e8 = (AnnotationCollector *)&printer.field_0x128;
      }
      io::Printer::Printer((Printer *)&info_output,pZVar6,'$',local_7e8);
      pFVar3 = std::
               unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                             *)package_dir.field_2._8_8_);
      FileGenerator::Generate(pFVar3,(Printer *)&info_output);
      pFVar3 = std::
               unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ::operator->((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                             *)package_dir.field_2._8_8_);
      error = (string *)
              &file_generators.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      FileGenerator::GenerateSiblings
                (pFVar3,(string *)local_230,context,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&all_annotations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)error);
      if ((__range3._5_1_ & 1) != 0) {
        iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_320);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
        ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                  ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                    *)&srclist_raw_output,(pointer)CONCAT44(extraout_var_00,iVar2));
        pZVar6 = std::
                 unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ::get(&srclist_raw_output);
        MessageLite::SerializeToZeroCopyStream
                  ((MessageLite *)&annotation_collector.annotation_proto_,pZVar6);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::~unique_ptr(&srclist_raw_output);
      }
      io::Printer::~Printer((Printer *)&info_output);
      io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
                ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                 &printer.field_0x128);
      GeneratedCodeInfo::~GeneratedCodeInfo
                ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     *)&annotations.field_0._impl_._cached_size_);
      std::__cxx11::string::~string((string *)local_320);
      std::__cxx11::string::~string((string *)local_270);
      std::__cxx11::string::~string((string *)local_230);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>_>
      ::operator++(&__end3_2);
    }
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ::clear((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
             *)local_1b0);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      iVar2 = (*context->_vptr_GeneratorContext[2])
                        (context,(undefined1 *)
                                 ((long)&file_options.annotation_list_file.field_2 + 8));
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&srclist_printer.field_0x128,(pointer)CONCAT44(extraout_var_01,iVar2));
      pZVar6 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                      *)&srclist_printer.field_0x128);
      io::Printer::Printer((Printer *)local_638,pZVar6,'$',(AnnotationCollector *)0x0);
      for (local_63c = 0;
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&all_annotations.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)(long)local_63c < sVar7; local_63c = local_63c + 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&annotation_list_raw_output,
                   "$filename$\n");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&all_annotations.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_63c
                             );
        io::Printer::Print<char[9],std::__cxx11::string>
                  ((Printer *)local_638,_annotation_list_raw_output,(char (*) [9])"filename",pvVar8)
        ;
      }
      io::Printer::~Printer((Printer *)local_638);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     *)&srclist_printer.field_0x128);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,&file_options);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&annotation_list_printer.field_0x128,(pointer)CONCAT44(extraout_var_02,iVar2));
      pZVar6 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                      *)&annotation_list_printer.field_0x128);
      io::Printer::Printer((Printer *)local_788,pZVar6,'$',(AnnotationCollector *)0x0);
      for (local_78c = 0; uVar5 = (ulong)local_78c,
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&file_generators.
                             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar5 < sVar7;
          local_78c = local_78c + 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_7a0,"$filename$\n");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&file_generators.
                                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_78c
                             );
        io::Printer::Print<char[9],std::__cxx11::string>
                  ((Printer *)local_788,local_7a0,(char (*) [9])"filename",pvVar8);
      }
      io::Printer::~Printer((Printer *)local_788);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     *)&annotation_list_printer.field_0x128);
    }
    this_local._7_1_ = 1;
LAB_001f68c1:
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ::~vector((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               *)local_1b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&file_generators.
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&all_annotations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               options.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "lite runtime generator option cannot be used with mutable API.");
    this_local._7_1_ = 0;
  }
LAB_001f690d:
  java::Options::~Options((Options *)&__range3);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      file_options.strip_nonfunctional_codegen = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<std::unique_ptr<FileGenerator>> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* mutable = */ false));
  }

  for (auto& file_generator : file_generators) {
    if (!file_generator->Validate(error)) {
      return false;
    }
  }

  for (auto& file_generator : file_generators) {
    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename =
        absl::StrCat(package_dir, file_generator->classname(), ".java");
    all_files.push_back(java_filename);
    std::string info_full_path = absl::StrCat(java_filename, ".pb.meta");
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : nullptr);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}